

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

void * flatcc_builder_start_struct(flatcc_builder_t *B,size_t size,uint16_t align)

{
  __flatcc_builder_frame_t *p_Var1;
  int iVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  iVar2 = enter_frame(B,align);
  if (iVar2 == 0) {
    p_Var1 = B->frame;
    p_Var1->type = 2;
    puVar3 = (uint8_t *)((ulong)B->ds_first + (long)B->buffers[1].iov_base);
    uVar5 = (int)B->buffers[1].iov_len - B->ds_first;
    B->ds = puVar3;
    uVar4 = 0xfffffffc;
    if (uVar5 < 0xfffffffc) {
      uVar4 = uVar5;
    }
    B->ds_limit = uVar4;
    p_Var1->type_limit = 0xfffffffc;
    uVar5 = B->ds_offset;
    uVar6 = (int)size + uVar5;
    B->ds_offset = uVar6;
    if (uVar4 <= uVar6) {
      iVar2 = reserve_ds(B,(ulong)(uVar6 + 1),0xfffffffc);
      if (iVar2 != 0) goto LAB_00105242;
      puVar3 = B->ds;
    }
    puVar3 = puVar3 + uVar5;
  }
  else {
LAB_00105242:
    puVar3 = (uint8_t *)0x0;
  }
  return puVar3;
}

Assistant:

void *flatcc_builder_start_struct(flatcc_builder_t *B, size_t size, uint16_t align)
{
    /* Allocate space for the struct on the ds stack. */
    if (enter_frame(B, align)) {
        return 0;
    }
    frame(type) = flatcc_builder_struct;
    refresh_ds(B, data_limit);
    return push_ds(B, (uoffset_t)size);
}